

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_sync(bcf_hdr_t *h)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  bcf_idpair_t *pbVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  for (lVar11 = 0; lVar8 = 0x28, lVar11 != 3; lVar11 = lVar11 + 1) {
    puVar2 = (uint *)h->dict[lVar11];
    uVar5 = (ulong)*puVar2;
    bVar7 = 0;
    uVar10 = 0xffffffff;
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      if (((*(uint *)(*(long *)(puVar2 + 4) + (uVar9 >> 4 & 0xfffffff) * 4) >> (bVar7 & 0x1e) & 3)
           == 0) && ((int)uVar10 <= (int)*(uint *)(*(long *)(puVar2 + 8) + lVar8))) {
        uVar10 = *(uint *)(*(long *)(puVar2 + 8) + lVar8);
      }
      bVar7 = bVar7 + 2;
      lVar8 = lVar8 + 0x30;
    }
    if (h->n[lVar11] <= (int)uVar10) {
      pbVar6 = (bcf_idpair_t *)realloc(h->id[lVar11],(ulong)(uVar10 + 1) << 4);
      h->id[lVar11] = pbVar6;
      for (uVar4 = h->n[lVar11]; uVar4 <= uVar10; uVar4 = uVar4 + 1) {
        h->id[lVar11][uVar4].key = (char *)0x0;
        h->id[lVar11][uVar4].val = (bcf_idinfo_t *)0x0;
      }
      h->n[lVar11] = uVar10 + 1;
      uVar5 = (ulong)*puVar2;
    }
    lVar8 = 0;
    bVar7 = 0;
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      if ((*(uint *)(*(long *)(puVar2 + 4) + (uVar9 >> 4 & 0xfffffff) * 4) >> (bVar7 & 0x1e) & 3) ==
          0) {
        lVar3 = *(long *)(puVar2 + 8);
        iVar1 = *(int *)(lVar3 + 0x28 + lVar8);
        h->id[lVar11][iVar1].key = *(char **)(*(long *)(puVar2 + 6) + uVar9 * 8);
        h->id[lVar11][iVar1].val = (bcf_idinfo_t *)(lVar3 + lVar8);
      }
      bVar7 = bVar7 + 2;
      lVar8 = lVar8 + 0x30;
    }
  }
  h->dirty = 0;
  return 0;
}

Assistant:

int bcf_hdr_sync(bcf_hdr_t *h)
{
    int i;
    for (i = 0; i < 3; i++)
    {
        vdict_t *d = (vdict_t*)h->dict[i];
        khint_t k;

        // find out the largest id, there may be holes because of IDX
        int max_id = -1;
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            if ( max_id < kh_val(d,k).id ) max_id = kh_val(d,k).id;
        }
        if ( max_id >= h->n[i] )
        {
            h->id[i] = (bcf_idpair_t*)realloc(h->id[i], (max_id+1)*sizeof(bcf_idpair_t));
            for (k=h->n[i]; k<=max_id; k++)
            {
                h->id[i][k].key = NULL;
                h->id[i][k].val = NULL;
            }
            h->n[i] = max_id+1;
        }
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            h->id[i][kh_val(d,k).id].key = kh_key(d,k);
            h->id[i][kh_val(d,k).id].val = &kh_val(d,k);
        }
    }
    h->dirty = 0;
    return 0;
}